

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O2

int absl::lts_20240722::time_internal::cctz::detail::get_yearday(civil_second *cs)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  
  cVar2 = (cs->f_).m;
  uVar3 = 0;
  if ('\x02' < cVar2) {
    bVar1 = impl::is_leap_year((cs->f_).y);
    uVar3 = (uint)bVar1;
    cVar2 = (cs->f_).m;
  }
  return (int)(cs->f_).d + uVar3 + *(int *)(&DAT_0010d4e0 + (long)cVar2 * 4);
}

Assistant:

CONSTEXPR_F int get_yearday(const civil_second& cs) noexcept {
  CONSTEXPR_D int k_month_offsets[1 + 12] = {
      -1, 0, 31, 59, 90, 120, 151, 181, 212, 243, 273, 304, 334,
  };
  const int feb29 = (cs.month() > 2 && impl::is_leap_year(cs.year()));
  return k_month_offsets[cs.month()] + feb29 + cs.day();
}